

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall TMndxMarFile::DoSearch(TMndxMarFile *this,TMndxSearch *pSearch,bool *pbFindResult)

{
  bool bVar1;
  int iVar2;
  TFileNameDatabase *this_00;
  
  this_00 = this->pDatabase;
  if (this_00 == (TFileNameDatabase *)0x0) {
    iVar2 = 0x16;
  }
  else {
    if (pSearch->pStruct40 == (TStruct40 *)0x0) {
      iVar2 = TMndxSearch::CreateStruct40(pSearch);
      if (iVar2 != 0) {
        return iVar2;
      }
      this_00 = this->pDatabase;
    }
    bVar1 = TFileNameDatabase::DoSearch(this_00,pSearch);
    *pbFindResult = bVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int DoSearch(TMndxSearch * pSearch, bool * pbFindResult)
    {
        int nError = ERROR_SUCCESS;

        if(pDatabase == NULL)
            return ERROR_INVALID_PARAMETER;

        // Create the pStruct40, if not initialized yet
        if(pSearch->pStruct40 == NULL)
        {
            nError = pSearch->CreateStruct40();
            if(nError != ERROR_SUCCESS)
                return nError;
        }

        *pbFindResult = pDatabase->DoSearch(pSearch);
        return nError;
    }